

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

string * __thiscall
pbrt::CameraBase::ToString_abi_cxx11_(string *__return_storage_ptr__,CameraBase *this)

{
  long lVar1;
  string local_58;
  char *local_38;
  
  lVar1 = (this->medium).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits << 0x10;
  if (lVar1 == 0) {
    local_38 = "(nullptr)";
  }
  else {
    MediumHandle::ToString_abi_cxx11_(&local_58,&this->medium);
    local_38 = local_58._M_dataplus._M_p;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::CameraTransform_const&,float_const&,float_const&,pbrt::FilmHandle_const&,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&>
            (__return_storage_ptr__,
             "cameraTransform: %s shutterOpen: %f shutterClose: %f film: %s medium: %s minPosDifferentialX: %s minPosDifferentialY: %s minDirDifferentialX: %s minDirDifferentialY: %s "
             ,&this->cameraTransform,&this->shutterOpen,&this->shutterClose,&this->film,&local_38,
             &this->minPosDifferentialX,&this->minPosDifferentialY,&this->minDirDifferentialX,
             &this->minDirDifferentialY);
  if ((lVar1 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2)) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CameraBase::ToString() const {
    return StringPrintf("cameraTransform: %s shutterOpen: %f shutterClose: %f film: %s "
                        "medium: %s minPosDifferentialX: %s minPosDifferentialY: %s "
                        "minDirDifferentialX: %s minDirDifferentialY: %s ",
                        cameraTransform, shutterOpen, shutterClose, film,
                        medium ? medium.ToString().c_str() : "(nullptr)",
                        minPosDifferentialX, minPosDifferentialY, minDirDifferentialX,
                        minDirDifferentialY);
}